

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundMap.cpp
# Opt level: O3

vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> * __thiscall
AI::SoundMap::collectSounds
          (vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> *__return_storage_ptr__,
          SoundMap *this,Vector2<float> position,int range)

{
  iterator __position;
  pointer pSVar1;
  Vector2<float> VVar2;
  AuditoryTag AVar3;
  Vector2<int> VVar4;
  ulong uVar5;
  pointer pSVar6;
  SoundWave *__args;
  pointer pSVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  (__return_storage_ptr__->super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VVar4 = calcGridCoordinates(position,this->resolution,this->gridSize);
  iVar9 = range / 2;
  fVar13 = Math::clamp((float)(VVar4.x - iVar9),0.0,(float)(this->gridSize).x);
  fVar14 = Math::clamp((float)(iVar9 + VVar4.x),0.0,(float)(this->gridSize).x);
  fVar15 = Math::clamp((float)(VVar4.y - iVar9),0.0,(float)(this->gridSize).y);
  fVar16 = Math::clamp((float)(iVar9 + VVar4.y),0.0,(float)(this->gridSize).y);
  if ((float)(int)fVar15 < fVar16) {
    iVar8 = (int)fVar15;
    lVar10 = (long)(int)fVar13;
    iVar9 = (int)fVar13;
    do {
      while ((float)iVar9 < fVar14) {
        iVar9 = (this->gridSize).x * iVar8;
        lVar11 = (long)(this->grid).super__Vector_base<AI::Cell,_std::allocator<AI::Cell>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar9 + (int)lVar10].numberOfWaves;
        if (0 < lVar11) {
          lVar12 = (iVar9 + lVar10) * 0x13c + 4;
          do {
            __args = (SoundWave *)
                     ((long)((this->grid).super__Vector_base<AI::Cell,_std::allocator<AI::Cell>_>.
                             _M_impl.super__Vector_impl_data._M_start)->intersectingWaves +
                     lVar12 + -4);
            __position._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>::
              _M_realloc_insert<AI::SoundWave_const&>
                        ((vector<AI::SoundWave,std::allocator<AI::SoundWave>> *)
                         __return_storage_ptr__,__position,__args);
            }
            else {
              VVar4 = __args->gridCoordinates;
              VVar2 = __args->originalPosition;
              fVar15 = __args->intensity;
              AVar3 = __args->tag;
              *(undefined8 *)&((__position._M_current)->originalPosition).y =
                   *(undefined8 *)&(__args->originalPosition).y;
              (__position._M_current)->intensity = fVar15;
              (__position._M_current)->tag = AVar3;
              (__position._M_current)->gridCoordinates = VVar4;
              (__position._M_current)->originalPosition = VVar2;
              (__return_storage_ptr__->
              super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            lVar12 = lVar12 + 0x1c;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        lVar10 = lVar10 + 1;
        iVar9 = (int)lVar10;
      }
      iVar8 = iVar8 + 1;
      lVar10 = (long)(int)fVar13;
      iVar9 = (int)fVar13;
    } while ((float)iVar8 < fVar16);
  }
  pSVar6 = (__return_storage_ptr__->
           super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (__return_storage_ptr__->
           super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar6 != pSVar1) {
    uVar5 = ((long)pSVar1 - (long)pSVar6 >> 2) * 0x6db6db6db6db6db7;
    lVar10 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<AI::SoundWave*,std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pSVar6,pSVar1,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<AI::SoundWave*,std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pSVar6,pSVar1);
    pSVar6 = (__return_storage_ptr__->
             super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (__return_storage_ptr__->
             super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar6 != pSVar1) {
      pSVar6 = pSVar6 + -1;
      do {
        pSVar7 = pSVar6;
        if (pSVar7 + 2 == pSVar1) {
          return __return_storage_ptr__;
        }
        pSVar6 = pSVar7 + 1;
      } while (pSVar7[1].id != pSVar7[2].id);
      for (pSVar7 = pSVar7 + 3; pSVar7 != pSVar1; pSVar7 = pSVar7 + 1) {
        if (pSVar6->id != pSVar7->id) {
          VVar4 = pSVar7->gridCoordinates;
          VVar2 = pSVar7->originalPosition;
          fVar13 = pSVar7->intensity;
          AVar3 = pSVar7->tag;
          *(undefined8 *)&pSVar6[1].originalPosition.y =
               *(undefined8 *)&(pSVar7->originalPosition).y;
          pSVar6[1].intensity = fVar13;
          pSVar6[1].tag = AVar3;
          pSVar6[1].gridCoordinates = VVar4;
          pSVar6[1].originalPosition = VVar2;
          pSVar6 = pSVar6 + 1;
        }
      }
      if (pSVar6 + 1 != pSVar1) {
        (__return_storage_ptr__->super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>).
        _M_impl.super__Vector_impl_data._M_finish = pSVar6 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SoundWave> SoundMap::collectSounds(Math::Vector2<float> position, int range) const
	{
		std::vector<SoundWave> waves;
		
		auto gridCoordinates = calcGridCoordinates(position, resolution, gridSize);

		auto minX = clamp(gridCoordinates.x - range / 2, 0, gridSize.x);
		auto maxX = clamp(gridCoordinates.x + range / 2, 0, gridSize.x);
		auto minY = clamp(gridCoordinates.y - range / 2, 0, gridSize.y);
		auto maxY = clamp(gridCoordinates.y + range / 2, 0, gridSize.y);

		for (int j = minY; j < maxY; j++)
		{
			for (int i = minX; i < maxX; i++)
			{
				auto index = i + j * gridSize.x;
				auto count = grid[index].numberOfWaves;

				for (int k = 0; k < count; k++)
				{
					waves.push_back(grid[index].intersectingWaves[k]);
				}
			}
		}

		std::sort(begin(waves), end(waves));
		waves.erase(std::unique(begin(waves), end(waves)), end(waves));

		return waves;
	}